

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O1

void __thiscall duckdb::CSVBufferManager::ResetBuffer(CSVBufferManager *this,idx_t buffer_idx)

{
  vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  int iVar5;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var6;
  reference pvVar7;
  CSVBuffer *pCVar8;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  **pp_Var9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_30;
  
  local_38 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)buffer_idx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->main_mutex);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  p_Var6 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)((long)(this->cached_buffers).
                     super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                     .
                     super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->cached_buffers).
                     super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                     .
                     super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_38 < p_Var6) {
    this_00 = &this->cached_buffers;
    if ((local_38 ==
         (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          *)0x0) &&
       ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)0x1 < p_Var6)) {
      pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[](this_00,0);
      p_Var1 = (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      pp_Var9 = &local_38;
      do {
        local_30 = *pp_Var9 + 1;
        uVar2 = (this->reset_when_possible)._M_h._M_bucket_count;
        uVar11 = (ulong)local_30 % uVar2;
        p_Var3 = (this->reset_when_possible)._M_h._M_buckets[uVar11];
        p_Var10 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var3, p_Var12 = p_Var3->_M_nxt,
           local_30 !=
           (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var4 = p_Var12->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var10 = (__node_base_ptr)0x0;
            if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar11) ||
               (p_Var10 = p_Var12, p_Var12 = p_Var4,
               local_30 ==
               (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)p_Var4[1]._M_nxt)) goto LAB_0167e5f5;
          }
          p_Var10 = (__node_base_ptr)0x0;
        }
LAB_0167e5f5:
        if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0))
        goto LAB_0167e65f;
        pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                           (this_00,(size_type)local_30);
        p_Var1 = (pvVar7->internal).
                 super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        ::std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
        pp_Var9 = &local_30;
      } while( true );
    }
    if ((local_38 ==
         (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          *)0x0) ||
       (pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                           (this_00,(size_type)(local_38 + -1)),
       (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0)) {
      local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->reset_when_possible;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                (local_30,&local_38);
    }
    else {
      pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                         (this_00,(size_type)local_38);
      pCVar8 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(pvVar7);
      if (pCVar8->last_buffer != true) {
        pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                           (this_00,(size_type)local_38);
        p_Var1 = (pvVar7->internal).
                 super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        pp_Var9 = &local_38;
        do {
          local_30 = *pp_Var9 + 1;
          uVar2 = (this->reset_when_possible)._M_h._M_bucket_count;
          uVar11 = (ulong)local_30 % uVar2;
          p_Var3 = (this->reset_when_possible)._M_h._M_buckets[uVar11];
          p_Var10 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var10 = p_Var3, p_Var12 = p_Var3->_M_nxt,
             local_30 !=
             (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var12->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var10 = (__node_base_ptr)0x0;
              if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar11) ||
                 (p_Var10 = p_Var12, p_Var12 = p_Var4,
                 local_30 ==
                 (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)p_Var4[1]._M_nxt)) goto LAB_0167e741;
            }
            p_Var10 = (__node_base_ptr)0x0;
          }
LAB_0167e741:
          if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0))
          goto LAB_0167e65f;
          pvVar7 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                             (this_00,(size_type)local_30);
          p_Var1 = (pvVar7->internal).
                   super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (pvVar7->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
          pp_Var9 = &local_30;
        } while( true );
      }
      ::std::
      vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
      ::clear(&this_00->
               super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
             );
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(&(this->reset_when_possible)._M_h);
    }
  }
LAB_0167e65f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->main_mutex);
  return;
}

Assistant:

void CSVBufferManager::ResetBuffer(const idx_t buffer_idx) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (buffer_idx >= cached_buffers.size()) {
		// Nothing to reset
		return;
	}
	D_ASSERT(cached_buffers[buffer_idx]);
	if (buffer_idx == 0 && cached_buffers.size() > 1) {
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
		return;
	}
	// We only reset if previous one was also already reset
	if (buffer_idx > 0 && !cached_buffers[buffer_idx - 1]) {
		if (cached_buffers[buffer_idx]->last_buffer) {
			// We clear the whole shebang
			cached_buffers.clear();
			reset_when_possible.clear();
			return;
		}
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
	} else {
		reset_when_possible.insert(buffer_idx);
	}
}